

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3FilterMethod(sqlite3_vtab_cursor *pCursor,int idxNum,char *idxStr,int nVal,
                    sqlite3_value **apVal)

{
  sqlite3_stmt **ppStmt;
  Fts3TokenAndCost *pFVar1;
  undefined8 *puVar2;
  byte bVar3;
  sqlite3_vtab *psVar4;
  Fts3Phrase *pFVar5;
  void *p;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  sqlite3_vtab *psVar11;
  char *pcVar12;
  i64 iVar13;
  ulong uVar14;
  size_t sVar15;
  Fts3Expr *pFVar16;
  Fts3Expr *pFVar17;
  Fts3TokenAndCost *pFVar18;
  ulong uVar19;
  Fts3Expr *pFVar20;
  ulong uVar21;
  char cVar22;
  sqlite3_value *psVar23;
  sqlite3_vtab_cursor *pp;
  ulong uVar24;
  long lVar25;
  long lVar26;
  Fts3Expr *pFVar27;
  Fts3Expr **__dest;
  long lVar28;
  uint uVar29;
  undefined1 uVar30;
  bool bVar31;
  bool bVar32;
  int nByte;
  int iEnd;
  int iBegin;
  sqlite3_tokenizer_cursor *pCursor_1;
  char *zByte;
  uint local_140;
  int local_13c;
  Fts3Expr *local_138;
  uint local_130;
  uint local_12c;
  ulong local_128;
  Fts3Cursor *local_120;
  char local_111;
  sqlite3_value *local_110;
  uint local_104;
  ulong local_100;
  uint local_f4;
  Fts3Expr *local_f0;
  Fts3TokenAndCost *local_e8;
  Fts3Expr *local_e0;
  uint local_d4;
  void *local_d0;
  ulong local_c8;
  Fts3TokenAndCost *local_c0;
  Fts3Expr *local_b8;
  long local_b0;
  int local_a4;
  Fts3Expr *local_a0;
  long local_98;
  Fts3TokenAndCost *local_90;
  int local_84;
  sqlite3_value *local_80;
  sqlite3_vtab *local_78;
  Fts3TokenAndCost *local_70;
  sqlite3_vtab_cursor *local_68;
  Fts3TokenAndCost *local_60;
  sqlite3_module *local_58;
  sqlite3_value *local_50;
  char *local_48;
  ulong local_40;
  long local_38;
  
  local_f4 = idxNum & 0xffff;
  if (local_f4 == 0) {
    local_80 = (sqlite3_value *)0x0;
  }
  else {
    local_80 = *apVal;
  }
  uVar10 = (uint)(local_f4 != 0);
  if (((uint)idxNum >> 0x10 & 1) == 0) {
    local_138 = (Fts3Expr *)0x0;
  }
  else {
    uVar14 = (ulong)uVar10;
    uVar10 = uVar10 + 1;
    local_138 = (Fts3Expr *)apVal[uVar14];
  }
  if (((uint)idxNum >> 0x11 & 1) == 0) {
    local_50 = (sqlite3_value *)0x0;
  }
  else {
    uVar14 = (ulong)uVar10;
    uVar10 = uVar10 + 1;
    local_50 = apVal[uVar14];
  }
  if (((uint)idxNum >> 0x12 & 1) == 0) {
    psVar23 = (sqlite3_value *)0x0;
  }
  else {
    psVar23 = apVal[uVar10];
  }
  psVar4 = pCursor->pVtab;
  sqlite3_finalize((sqlite3_stmt *)pCursor[2].pVtab);
  sqlite3_free(pCursor[8].pVtab);
  sqlite3_free(pCursor[0xf].pVtab);
  sqlite3Fts3ExprFree((Fts3Expr *)pCursor[3].pVtab);
  memset(pCursor + 1,0,0x88);
  psVar11 = (sqlite3_vtab *)fts3DocidRange(local_50,-0x8000000000000000);
  pCursor[0xc].pVtab = psVar11;
  local_110 = psVar23;
  psVar11 = (sqlite3_vtab *)fts3DocidRange(psVar23,0x7fffffffffffffff);
  psVar23 = local_110;
  pCursor[0xd].pVtab = psVar11;
  if (idxStr == (char *)0x0) {
    uVar30 = psVar4[0x12].field_0xf;
  }
  else {
    uVar30 = *idxStr == 'D';
  }
  *(undefined1 *)((long)&pCursor[9].pVtab + 4) = uVar30;
  *(short *)&pCursor[1].pVtab = (short)idxNum;
  uVar10 = 0;
  local_78 = psVar4;
  if (local_f4 < 2) goto LAB_0017c91b;
  local_60 = (Fts3TokenAndCost *)sqlite3ValueText(local_80,'\x01');
  if ((local_60 != (Fts3TokenAndCost *)0x0) ||
     (uVar10._0_2_ = local_80->flags, uVar10._2_1_ = local_80->enc,
     uVar10._3_1_ = local_80->field_0xb, (0xaaaaaaaaU >> (uVar10 & 0x1f) & 1) != 0)) {
    *(undefined4 *)&pCursor[4].pVtab = 0;
    if (local_138 != (Fts3Expr *)0x0) {
      iVar13 = sqlite3VdbeIntValue((Mem *)local_138);
      *(int *)&pCursor[4].pVtab = (int)iVar13;
    }
    pFVar18 = local_60;
    pp = pCursor + 3;
    local_120 = (Fts3Cursor *)pCursor;
    local_d4 = idxNum;
    if (local_60 != (Fts3TokenAndCost *)0x0) {
      local_f4 = local_f4 - 2;
      lVar25 = *(long *)&local_78[2].nRef;
      local_58 = local_78[3].pModule;
      local_84 = *(int *)&pCursor[4].pVtab;
      uVar10 = *(uint *)&local_78[2].pModule;
      local_111 = local_78[0x12].field_0xc;
      local_68 = pp;
      uVar14 = strlen((char *)local_60);
      local_38 = (ulong)uVar10 - 1;
      local_104 = 1;
      local_f0 = (Fts3Expr *)0x0;
      uVar8 = 0;
      local_b8 = (Fts3Expr *)0x0;
      local_e0 = (Fts3Expr *)0x0;
      local_98 = lVar25;
      local_90 = pFVar18;
      local_40 = (ulong)uVar10;
LAB_0017b959:
      if (uVar8 == 0) {
        uVar10 = (uint)uVar14;
        pFVar18 = local_90;
        if (0 < (int)uVar10) {
          uVar19 = uVar14 & 0xffffffff;
          do {
            uVar10 = (uint)uVar19;
            if ((4 < *(byte *)&pFVar18->pPhrase - 9) && (*(byte *)&pFVar18->pPhrase != 0x20))
            goto LAB_0017b9a5;
            pFVar18 = (Fts3TokenAndCost *)((long)&pFVar18->pPhrase + 1);
            uVar19 = (ulong)(uVar10 - 1);
          } while (1 < (int)uVar10);
          uVar10 = 0;
          pFVar18 = (Fts3TokenAndCost *)((long)&local_90->pPhrase + (uVar14 & 0xffffffff));
        }
LAB_0017b9a5:
        bVar31 = true;
        local_100 = uVar14;
        if (uVar10 != 0) {
          pFVar17 = (Fts3Expr *)(ulong)uVar10;
          local_b0 = (long)pFVar18 - (long)local_90;
          local_a0 = (Fts3Expr *)0x0;
          uVar19 = 0;
          lVar26 = 0;
          local_138 = pFVar17;
          local_e8 = pFVar18;
          do {
            lVar28 = lVar26 * 0x10;
            iVar9 = 6;
            if ((&DAT_001b3c59)[lVar28] == '\0') {
              uVar21 = (ulong)(byte)(&DAT_001b3c58)[lVar28];
              iVar9 = 0;
              if (((int)(uint)(byte)(&DAT_001b3c58)[lVar28] <= (int)pFVar17) &&
                 (local_128 = uVar19,
                 iVar6 = bcmp(pFVar18,(&getNextNode_aKeyword)[lVar26 * 2],uVar21),
                 uVar19 = local_128, pFVar17 = local_138, pFVar18 = local_e8, iVar6 == 0)) {
                iVar6 = 10;
                local_c8 = CONCAT44(local_c8._4_4_,(uint)(byte)(&DAT_001b3c5a)[lVar28]);
                if (((byte)(&DAT_001b3c5a)[lVar28] == 1) &&
                   ((*(char *)((long)&local_e8->pPhrase + 4) == '/' &&
                    (cVar22 = *(char *)((long)&local_e8->pPhrase + 5), (byte)(cVar22 - 0x30U) < 10))
                   )) {
                  iVar6 = 0;
                  lVar25 = 6;
                  do {
                    iVar6 = (uint)(byte)(cVar22 - 0x30) + iVar6 * 10;
                    cVar22 = *(char *)((long)&local_e8->pPhrase + lVar25);
                    lVar25 = lVar25 + 1;
                  } while ((byte)(cVar22 - 0x30U) < 10);
                  uVar21 = (ulong)((int)lVar25 - 1);
                }
                bVar3 = *(byte *)((long)&local_e8->pPhrase + uVar21);
                local_d0 = (void *)(ulong)bVar3;
                uVar24 = 0xffffc1ffL >> (bVar3 & 0x3f);
                if (((uVar24 & 1) == 0 && bVar3 < 0x21) ||
                   ((bVar3 < 0x2a && ((0x30400000001U >> ((ulong)local_d0 & 0x3f) & 1) != 0)))) {
                  iVar7 = sqlite3_initialize();
                  if (iVar7 == 0) {
                    pFVar17 = (Fts3Expr *)sqlite3Malloc(0x40);
                  }
                  else {
                    pFVar17 = (Fts3Expr *)0x0;
                  }
                  if (pFVar17 == (Fts3Expr *)0x0) {
                    local_12c = 7;
                    uVar19 = local_128;
                  }
                  else {
                    pFVar17->eType = 0;
                    pFVar17->nNear = 0;
                    pFVar17->pParent = (Fts3Expr *)0x0;
                    pFVar17->bEof = '\0';
                    pFVar17->bStart = '\0';
                    pFVar17->bDeferred = '\0';
                    *(undefined5 *)&pFVar17->field_0x33 = 0;
                    pFVar17->aMI = (u32 *)0x0;
                    pFVar17->pPhrase = (Fts3Phrase *)0x0;
                    pFVar17->iDocid = 0;
                    pFVar17->pLeft = (Fts3Expr *)0x0;
                    pFVar17->pRight = (Fts3Expr *)0x0;
                    pFVar17->eType = (int)local_c8;
                    pFVar17->nNear = iVar6;
                    local_12c = 0;
                    uVar19 = (ulong)(uint)((int)uVar21 + (int)local_b0);
                    local_a0 = pFVar17;
                  }
                }
                uVar14 = local_100;
                pFVar18 = local_e8;
                pFVar17 = local_138;
                lVar25 = local_98;
                if ((uVar24 & 1) == 0 && bVar3 < 0x21) {
                  iVar9 = 1;
                }
                else if ((bVar3 < 0x2a) && ((0x30400000001U >> ((ulong)local_d0 & 0x3f) & 1) != 0))
                {
                  iVar9 = 1;
                }
              }
            }
            pFVar16 = local_a0;
            psVar23 = local_110;
            pCursor = &local_120->base;
            if ((iVar9 != 6) && (uVar8 = local_12c, iVar9 != 0)) goto LAB_0017c346;
            lVar26 = lVar26 + 1;
          } while (lVar26 != 4);
          if (*(char *)&pFVar18->pPhrase == '\"') {
            uVar8 = 1;
            pFVar27 = (Fts3Expr *)0x1;
            if (1 < (int)pFVar17) {
              pFVar27 = (Fts3Expr *)0x1;
              do {
                if (*(char *)((long)&pFVar27->eType + (long)&pFVar18->pPhrase) == '\"')
                goto LAB_0017bbfe;
                pFVar27 = (Fts3Expr *)((long)&pFVar27->eType + 1);
              } while (pFVar17 != pFVar27);
              pFVar27 = (Fts3Expr *)((ulong)pFVar17 & 0xffffffff);
            }
LAB_0017bbfe:
            iVar9 = (int)pFVar27;
            uVar19 = (ulong)((int)local_b0 + iVar9 + 1);
            if (iVar9 == (int)pFVar17) goto LAB_0017c346;
            pcVar12 = (char *)((long)&pFVar18->pPhrase + 1);
            local_b0 = *(long *)&local_58->iVersion;
            local_c0 = (Fts3TokenAndCost *)0x0;
            local_128 = uVar19;
            uVar8 = sqlite3Fts3OpenTokenizer
                              ((sqlite3_tokenizer *)local_58,local_84,pcVar12,iVar9 + -1,
                               (sqlite3_tokenizer_cursor **)&local_c0);
            if (uVar8 == 0) {
              lVar25 = 0xa8;
              uVar10 = 1;
              pFVar18 = (Fts3TokenAndCost *)0x0;
              local_c8 = 0;
              local_d0 = (void *)0x0;
              local_138 = (Fts3Expr *)0x0;
              local_48 = pcVar12;
              do {
                local_140 = 0;
                local_130 = 0;
                local_13c = 0;
                local_a4 = 0;
                uVar8 = (**(code **)(local_b0 + 0x28))
                                  ((sqlite3_tokenizer_cursor *)local_c0,(char **)&local_70,
                                   (int *)&local_140,(int *)&local_130,&local_13c,&local_a4);
                bVar32 = true;
                if (uVar8 == 0) {
                  local_12c = uVar8;
                  local_138 = (Fts3Expr *)fts3ReallocOrFree(local_138,(int)lVar25 + 0x18);
                  iVar6 = 5;
                  if (local_138 == (Fts3Expr *)0x0) {
                    bVar32 = false;
                    uVar8 = local_12c;
                  }
                  else {
                    iVar6 = (int)local_c8;
                    local_d0 = fts3ReallocOrFree(local_d0,local_140 + iVar6);
                    pFVar17 = local_138;
                    if (local_d0 == (void *)0x0) {
                      local_d0 = (void *)0x0;
                      bVar32 = false;
                      iVar6 = 5;
                      pFVar16 = local_a0;
                      uVar8 = local_12c;
                    }
                    else {
                      puVar2 = (undefined8 *)((long)&local_138->eType + lVar25);
                      *puVar2 = 0;
                      puVar2[1] = 0;
                      puVar2 = (undefined8 *)((long)local_138 + lVar25 + -0x10);
                      *puVar2 = 0;
                      puVar2[1] = 0;
                      *(undefined8 *)((long)&local_138->pLeft + lVar25) = 0;
                      memcpy((void *)((long)iVar6 + (long)local_d0),local_70,(long)(int)local_140);
                      uVar8 = 0;
                      *(uint *)((long)pFVar17 + lVar25 + -8) = local_140;
                      if (local_13c < iVar9 + -1) {
                        uVar8 = (uint)(local_48[local_13c] == '*');
                      }
                      *(uint *)((long)local_138 + lVar25 + -4) = uVar8;
                      iVar6 = 0;
                      uVar8 = 0;
                      if (0 < (long)(int)local_130) {
                        uVar8 = (uint)(*(char *)((long)&local_e8->pPhrase + (long)(int)local_130) ==
                                      '^');
                      }
                      local_c8 = (ulong)((int)local_c8 + local_140);
                      *(uint *)((long)&local_138->eType + lVar25) = uVar8;
                      pFVar18 = (Fts3TokenAndCost *)(ulong)uVar10;
                      pFVar16 = local_a0;
                      uVar8 = local_12c;
                    }
                  }
                }
                else {
                  iVar6 = 0;
                }
                if (!bVar32) goto LAB_0017c237;
                lVar25 = lVar25 + 0x28;
                uVar10 = uVar10 + 1;
              } while (uVar8 == 0);
              (**(code **)(local_b0 + 0x20))((sqlite3_tokenizer_cursor *)local_c0);
              local_c0 = (Fts3TokenAndCost *)0x0;
              iVar6 = 0;
LAB_0017c237:
              uVar14 = local_100;
              lVar25 = local_98;
              pCursor = &local_120->base;
              psVar23 = local_110;
              if (iVar6 != 5) {
                uVar19 = local_128;
                uVar21 = local_c8;
                if (iVar6 != 0) goto LAB_0017c346;
                goto LAB_0017bdd2;
              }
LAB_0017c2bf:
              pFVar17 = local_138;
              if (local_c0 != (Fts3TokenAndCost *)0x0) {
                (**(code **)(local_b0 + 0x20))((sqlite3_tokenizer_cursor *)local_c0);
              }
              sqlite3_free(local_d0);
              sqlite3_free(pFVar17);
              pFVar16 = (Fts3Expr *)0x0;
              uVar19 = local_128;
              uVar8 = 7;
            }
            else {
              local_138 = (Fts3Expr *)0x0;
              local_d0 = (void *)0x0;
              pFVar18 = (Fts3TokenAndCost *)0x0;
              uVar21 = 0;
LAB_0017bdd2:
              pCursor = &local_120->base;
              if (uVar8 == 0x65) {
                local_e8 = pFVar18;
                local_c8 = uVar21;
                pFVar17 = (Fts3Expr *)
                          fts3ReallocOrFree(local_138,(int)uVar21 + (int)pFVar18 * 0x28 + 0xc0);
                local_138 = pFVar17;
                if (pFVar17 == (Fts3Expr *)0x0) {
                  iVar9 = 5;
                  uVar8 = 0x65;
                }
                else {
                  iVar9 = (int)local_e8;
                  memset(pFVar17,0,0x98);
                  p = local_d0;
                  pFVar17->eType = 5;
                  pFVar17->pPhrase = (Fts3Phrase *)(pFVar17 + 1);
                  *(uint *)((long)&pFVar17[2].pLeft + 4) = local_f4;
                  *(int *)&pFVar17[2].pLeft = iVar9;
                  __dest = &pFVar17[2].pRight + (long)iVar9 * 5;
                  if (local_d0 != (void *)0x0) {
                    memcpy(__dest,local_d0,(long)(int)local_c8);
                    sqlite3_free(p);
                  }
                  pFVar5 = pFVar17->pPhrase;
                  iVar9 = pFVar5->nToken;
                  uVar8 = 0;
                  if (0 < (long)iVar9) {
                    lVar26 = 0;
                    do {
                      *(Fts3Expr ***)((long)&pFVar5->aToken[0].z + lVar26) = __dest;
                      __dest = (Fts3Expr **)
                               ((long)__dest + (long)*(int *)((long)&pFVar5->aToken[0].n + lVar26));
                      lVar26 = lVar26 + 0x28;
                    } while ((long)iVar9 * 0x28 != lVar26);
                  }
                  iVar9 = 0;
                  pFVar16 = local_a0;
                  pCursor = &local_120->base;
                  psVar23 = local_110;
                }
                if (iVar9 == 5) goto LAB_0017c2bf;
                uVar19 = local_128;
                if (iVar9 != 0) goto LAB_0017c346;
              }
              uVar19 = local_128;
              pFVar16 = local_138;
            }
            goto LAB_0017c346;
          }
          uVar19 = local_128 >> 0x20;
          local_128 = uVar19 << 0x20;
          uVar10 = local_f4;
          if (0 < (int)local_40) {
            local_128 = uVar19 << 0x20;
            lVar26 = 0;
            do {
              pcVar12 = *(char **)(lVar25 + lVar26 * 8);
              sVar15 = strlen(pcVar12);
              iVar9 = (int)sVar15;
              if (((iVar9 < (int)local_138) &&
                  (*(char *)((long)&local_e8->pPhrase + (long)iVar9) == ':')) &&
                 (iVar6 = sqlite3_strnicmp(pcVar12,(char *)local_e8,iVar9), iVar6 == 0)) {
                local_128 = CONCAT44(local_128._4_4_,(int)local_b0 + iVar9 + 1);
                bVar31 = true;
                uVar10 = (uint)lVar26;
              }
              else {
                bVar31 = false;
              }
            } while ((!bVar31) && (bVar31 = local_38 != lVar26, lVar26 = lVar26 + 1, bVar31));
          }
          pcVar12 = (char *)((long)&local_90->pPhrase + (long)(int)local_128);
          local_138 = *(Fts3Expr **)&local_58->iVersion;
          uVar29 = (int)uVar14 - (int)local_128;
          uVar19 = 0;
          if (uVar29 != 0 && (int)local_128 <= (int)uVar14) {
            uVar19 = 0;
            do {
              if (pcVar12[uVar19] == '\"') goto LAB_0017bd21;
              uVar19 = uVar19 + 1;
            } while (uVar29 != uVar19);
            uVar19 = (ulong)uVar29;
          }
LAB_0017bd21:
          iVar9 = (int)uVar19;
          uVar8 = sqlite3Fts3OpenTokenizer
                            ((sqlite3_tokenizer *)local_58,local_84,pcVar12,iVar9,
                             (sqlite3_tokenizer_cursor **)&local_c0);
          if (uVar8 == 0) {
            local_140 = 0;
            local_130 = 0;
            local_13c = 0;
            local_a4 = 0;
            local_e8 = local_c0;
            uVar8 = (*(code *)local_138->iDocid)(local_c0,&local_70,&local_140);
            if (uVar8 == 0) {
              iVar9 = local_140 + 0xc0;
              pFVar16 = (Fts3Expr *)sqlite3_malloc(iVar9);
              if (pFVar16 != (Fts3Expr *)0x0) {
                memset(pFVar16,0,(long)iVar9);
                pFVar16->eType = 5;
                pFVar16->pPhrase = (Fts3Phrase *)(pFVar16 + 1);
                *(undefined4 *)&pFVar16[2].pLeft = 1;
                *(uint *)((long)&pFVar16[2].pLeft + 4) = uVar10;
                *(uint *)&pFVar16[2].pPhrase = local_140;
                pFVar16[2].pRight = pFVar16 + 3;
                memcpy(pFVar16 + 3,local_70,(long)(int)local_140);
                if ((local_13c < (int)uVar29) && (pcVar12[local_13c] == '*')) {
                  *(undefined4 *)((long)&pFVar16[2].pPhrase + 4) = 1;
                  local_13c = local_13c + 1;
                }
                bVar31 = false;
                do {
                  if (((int)local_130 < 1) || (bVar32 = true, pcVar12[(ulong)local_130 - 1] != '-'))
                  {
                    if ((local_111 == '\0') ||
                       (((int)local_130 < 1 || (pcVar12[(ulong)local_130 - 1] != '^'))))
                    goto LAB_0017c26f;
                    pFVar16->pPhrase->aToken[0].bFirst = 1;
                    bVar32 = bVar31;
                  }
                  bVar31 = bVar32;
                  local_130 = local_130 - 1;
                } while( true );
              }
              local_12c = 7;
              bVar31 = true;
              uVar14 = local_100;
              iVar9 = local_13c;
            }
            else {
              local_12c = uVar8;
              if (uVar8 == 0x65) {
                local_12c = 0;
              }
              if (iVar9 == 0) {
                local_12c = uVar8;
              }
              bVar31 = true;
              pFVar16 = (Fts3Expr *)0x0;
            }
            goto LAB_0017c31e;
          }
          bVar31 = true;
          pFVar16 = (Fts3Expr *)0x0;
          pCursor = &local_120->base;
          psVar23 = local_110;
          goto LAB_0017c33c;
        }
        pFVar16 = (Fts3Expr *)0x0;
        uVar19 = 0;
        uVar8 = 0x65;
        goto LAB_0017c346;
      }
      uVar10 = 1;
      if (local_104 == 0) {
        uVar10 = uVar8;
      }
      if (local_f0 == (Fts3Expr *)0x0) {
        uVar10 = uVar8;
      }
      if (uVar8 == 0x65) {
        uVar8 = uVar10;
      }
      pFVar17 = local_f0;
      if (uVar8 == 0x65) {
        bVar31 = local_b8 != (Fts3Expr *)0x0;
        uVar8 = (uint)bVar31;
        if ((bVar31) && (pFVar16 = local_b8, uVar8 = (uint)bVar31, local_f0 != (Fts3Expr *)0x0)) {
          do {
            pFVar17 = pFVar16;
            pFVar16 = pFVar17->pLeft;
          } while (pFVar17->pLeft != (Fts3Expr *)0x0);
          pFVar17->pLeft = local_f0;
          local_f0->pParent = pFVar17;
          pFVar17 = local_b8;
          uVar8 = 0;
        }
      }
      goto LAB_0017c6f3;
    }
    pFVar17 = (Fts3Expr *)0x0;
    uVar10 = 0;
    goto LAB_0017c712;
  }
  pcVar12 = (char *)0x7;
  uVar10 = 0;
  bVar31 = false;
LAB_0017c912:
  if (!bVar31) {
    return (int)pcVar12;
  }
LAB_0017c91b:
  psVar4 = local_78;
  ppStmt = &((Fts3Cursor *)pCursor)->pStmt;
  if ((short)idxNum == 1) {
    uVar10 = fts3CursorSeekStmt((Fts3Cursor *)pCursor,ppStmt);
    if (uVar10 == 0) {
      uVar10 = sqlite3_bind_value(*ppStmt,1,local_80);
    }
  }
  else if ((idxNum & 0xffffU) == 0) {
    local_50 = (sqlite3_value *)((ulong)local_50 | (ulong)psVar23);
    if (local_50 == (sqlite3_value *)0x0) {
      pcVar12 = "DESC";
      if (((Fts3Cursor *)pCursor)->bDesc == '\0') {
        pcVar12 = "ASC";
      }
      pcVar12 = sqlite3_mprintf("SELECT %s ORDER BY rowid %s",local_78[0x11].zErrMsg,pcVar12);
    }
    else {
      pcVar12 = sqlite3_mprintf("SELECT %s WHERE rowid BETWEEN %lld AND %lld ORDER BY rowid %s",
                                local_78[0x11].zErrMsg,((Fts3Cursor *)pCursor)->iMinDocid,
                                ((Fts3Cursor *)pCursor)->iMaxDocid);
    }
    if (pcVar12 == (char *)0x0) {
      uVar10 = 7;
    }
    else {
      uVar10 = sqlite3LockAndPrepare
                         ((sqlite3 *)psVar4[1].pModule,pcVar12,-1,1,(Vdbe *)0x0,ppStmt,(char **)0x0)
      ;
      sqlite3_free(pcVar12);
    }
  }
  if (uVar10 == 0) {
    uVar10 = fts3NextMethod(pCursor);
  }
  return uVar10;
LAB_0017c26f:
  bVar31 = !bVar31;
  local_12c = 0;
  uVar14 = local_100;
  iVar9 = local_13c;
LAB_0017c31e:
  psVar23 = local_110;
  pCursor = &local_120->base;
  (*(code *)local_138->pPhrase)(local_e8);
  lVar25 = local_98;
  uVar8 = local_12c;
LAB_0017c33c:
  uVar19 = (ulong)(uint)(iVar9 + (int)local_128);
LAB_0017c346:
  if ((uVar8 == 0) && (pFVar16 != (Fts3Expr *)0x0)) {
    iVar9 = pFVar16->eType;
    if (iVar9 == 5) {
      bVar32 = true;
      if (bVar31) goto LAB_0017c38e;
      iVar9 = sqlite3_initialize();
      if (iVar9 == 0) {
        pFVar17 = (Fts3Expr *)sqlite3Malloc(0x40);
      }
      else {
        pFVar17 = (Fts3Expr *)0x0;
      }
      uVar14 = local_100;
      if (pFVar17 == (Fts3Expr *)0x0) {
        sqlite3Fts3ExprFree(pFVar16);
        uVar10 = 4;
        uVar8 = 7;
      }
      else {
        pFVar17->eType = 0;
        pFVar17->nNear = 0;
        pFVar17->pParent = (Fts3Expr *)0x0;
        pFVar17->pLeft = (Fts3Expr *)0x0;
        pFVar17->pRight = (Fts3Expr *)0x0;
        pFVar17->bEof = '\0';
        pFVar17->bStart = '\0';
        pFVar17->bDeferred = '\0';
        *(undefined5 *)&pFVar17->field_0x33 = 0;
        pFVar17->aMI = (u32 *)0x0;
        pFVar17->pPhrase = (Fts3Phrase *)0x0;
        pFVar17->iDocid = 0;
        pFVar17->eType = 2;
        pFVar17->pRight = pFVar16;
        pFVar16->pParent = pFVar17;
        uVar8 = 0;
        if (local_b8 != (Fts3Expr *)0x0) {
          pFVar17->pLeft = local_b8;
          local_b8->pParent = pFVar17;
        }
        uVar10 = 0;
        pFVar16 = local_e0;
        local_b8 = pFVar17;
      }
      psVar23 = local_110;
      if (pFVar17 != (Fts3Expr *)0x0) goto LAB_0017c609;
    }
    else {
      bVar32 = pFVar16->pLeft != (Fts3Expr *)0x0;
LAB_0017c38e:
      if ((bVar32) || (local_104 == 0)) {
        uVar8 = 0;
        cVar22 = (char)(bVar32 ^ 1);
        local_128 = uVar19;
        if (local_104 == 0 && cVar22 == '\0') {
          iVar6 = sqlite3_initialize();
          if (iVar6 == 0) {
            pFVar17 = (Fts3Expr *)sqlite3Malloc(0x40);
          }
          else {
            pFVar17 = (Fts3Expr *)0x0;
          }
          if (pFVar17 == (Fts3Expr *)0x0) {
            sqlite3Fts3ExprFree(pFVar16);
            uVar10 = 4;
            uVar8 = 7;
          }
          else {
            pFVar17->eType = 0;
            pFVar17->nNear = 0;
            pFVar17->pParent = (Fts3Expr *)0x0;
            pFVar17->bEof = '\0';
            pFVar17->bStart = '\0';
            pFVar17->bDeferred = '\0';
            *(undefined5 *)&pFVar17->field_0x33 = 0;
            pFVar17->aMI = (u32 *)0x0;
            pFVar17->pPhrase = (Fts3Phrase *)0x0;
            pFVar17->iDocid = 0;
            pFVar17->pLeft = (Fts3Expr *)0x0;
            pFVar17->pRight = (Fts3Expr *)0x0;
            pFVar17->eType = 3;
            do {
              pFVar27 = local_e0;
              local_e0 = pFVar27->pParent;
            } while (pFVar27->pParent != (Fts3Expr *)0x0);
            pFVar17->pLeft = pFVar27;
            pFVar27->pParent = pFVar17;
            uVar8 = 0;
            uVar10 = 0;
            local_f0 = pFVar17;
            local_e0 = pFVar17;
          }
          psVar23 = local_110;
          if (pFVar17 == (Fts3Expr *)0x0) {
            local_104 = 0;
            uVar19 = local_128;
            goto LAB_0017c605;
          }
        }
        if ((local_e0 == (Fts3Expr *)0x0) ||
           (((iVar9 != 1 || bVar32 != false || (local_e0->eType == 5)) &&
            ((iVar9 == 5 || cVar22 != '\0' || (local_e0->eType != 1)))))) {
          pFVar17 = local_e0;
          pFVar27 = pFVar16;
          if (bVar32 == false) {
            do {
              pFVar20 = pFVar17;
              pFVar17 = pFVar20->pParent;
              if (pFVar17 == (Fts3Expr *)0x0) goto LAB_0017c5e5;
            } while ((pFVar17->eType == 1) ||
                    (pFVar16->eType != 1 && (pFVar17->eType == 4 || pFVar16->eType != 4)));
            pFVar17->pRight = pFVar16;
            pFVar16->pParent = pFVar17;
            pFVar27 = local_f0;
LAB_0017c5e5:
            pFVar16->pLeft = pFVar20;
            pFVar20->pParent = pFVar16;
          }
          else if (local_f0 != (Fts3Expr *)0x0) {
            local_e0->pRight = pFVar16;
            pFVar16->pParent = local_e0;
            pFVar27 = local_f0;
          }
          uVar10 = 0;
          uVar19 = local_128;
          local_104 = bVar32 ^ 1;
          local_f0 = pFVar27;
        }
        else {
          sqlite3Fts3ExprFree(pFVar16);
          uVar10 = 4;
          uVar8 = 1;
          uVar19 = local_128;
        }
      }
      else {
        sqlite3Fts3ExprFree(pFVar16);
        uVar10 = 4;
        uVar8 = 1;
        local_104 = 1;
      }
LAB_0017c605:
      uVar14 = local_100;
      if (uVar10 == 0) {
LAB_0017c609:
        uVar10 = 0;
        local_e0 = pFVar16;
      }
    }
    pCursor = &local_120->base;
    if (uVar10 != 0) goto LAB_0017c628;
  }
  uVar14 = (ulong)(uint)((int)uVar14 - (int)uVar19);
  local_90 = (Fts3TokenAndCost *)((long)&local_90->pPhrase + (long)(int)uVar19);
  uVar10 = 0;
LAB_0017c628:
  if (uVar10 != 0) goto code_r0x0017c630;
  goto LAB_0017b959;
code_r0x0017c630:
  pp = local_68;
  pFVar17 = local_f0;
  if (uVar10 == 4) {
LAB_0017c6f3:
    uVar10 = uVar8;
    pp = local_68;
    pFVar16 = local_b8;
    if (uVar10 != 0) {
      sqlite3Fts3ExprFree(pFVar17);
      sqlite3Fts3ExprFree(pFVar16);
      pFVar17 = (Fts3Expr *)0x0;
    }
LAB_0017c712:
    pp->pVtab = (sqlite3_vtab *)pFVar17;
  }
  idxNum = local_d4;
  if (uVar10 == 0) {
    if ((Fts3Expr *)pp->pVtab == (Fts3Expr *)0x0) {
      uVar10 = 0;
    }
    else {
      uVar10 = fts3ExprBalance((Fts3Expr **)pp,0xc);
      if (uVar10 == 0) {
        uVar10 = fts3ExprCheckDepth((Fts3Expr *)pp->pVtab,0xc);
      }
    }
  }
  if (uVar10 == 0) {
    pcVar12 = (char *)0x0;
  }
  else {
    sqlite3Fts3ExprFree((Fts3Expr *)pp->pVtab);
    pp->pVtab = (sqlite3_vtab *)0x0;
    if (uVar10 == 1) {
      pcVar12 = sqlite3_mprintf("malformed MATCH expression: [%s]",local_60);
    }
    else {
      pcVar12 = (char *)(ulong)uVar10;
      if (uVar10 != 0x12) goto LAB_0017c7a4;
      pcVar12 = sqlite3_mprintf("FTS expression tree is too large (maximum depth %d)",0xc);
    }
    local_78->zErrMsg = pcVar12;
    pcVar12 = (char *)0x1;
  }
LAB_0017c7a4:
  bVar31 = false;
  uVar10 = (uint)pcVar12;
  if (uVar10 == 0) {
    psVar4 = (((Fts3Cursor *)pCursor)->base).pVtab;
    local_140 = 0;
    local_130 = 0;
    local_13c = 0;
    fts3EvalAllocateReaders
              ((Fts3Cursor *)pCursor,((Fts3Cursor *)pCursor)->pExpr,(int *)&local_130,&local_13c,
               (int *)&local_140);
    if ((1 < (int)local_130 && local_140 == 0) && (psVar4[0x12].field_0xc != '\0')) {
      pFVar18 = (Fts3TokenAndCost *)sqlite3_malloc(local_13c * 0x10 + local_130 * 0x28);
      if (pFVar18 == (Fts3TokenAndCost *)0x0) {
        local_140 = 7;
      }
      else {
        pFVar1 = pFVar18 + (int)local_130;
        local_c0 = pFVar18;
        local_70 = pFVar1;
        fts3EvalTokenCosts((Fts3Cursor *)pCursor,(Fts3Expr *)0x0,((Fts3Cursor *)pCursor)->pExpr,
                           &local_c0,(Fts3Expr ***)&local_70,(int *)&local_140);
        local_130 = (int)((ulong)((long)local_c0 - (long)pFVar18) >> 3) * -0x33333333;
        local_13c = (int)((ulong)((long)local_70 - (long)pFVar1) >> 3);
        if (((local_140 == 0) &&
            (local_140 = fts3EvalSelectDeferred(local_120,(Fts3Expr *)0x0,pFVar18,local_130),
            local_140 == 0)) && (0 < local_13c)) {
          lVar25 = 1;
          do {
            local_140 = 0;
            local_140 = fts3EvalSelectDeferred
                                  (local_120,*(Fts3Expr **)((long)pFVar1 + lVar25 * 8 + -8),pFVar18,
                                   local_130);
            if (local_140 != 0) break;
            bVar31 = lVar25 < local_13c;
            lVar25 = lVar25 + 1;
          } while (bVar31);
        }
        sqlite3_free(pFVar18);
        pCursor = &local_120->base;
      }
    }
    fts3EvalStartReaders((Fts3Cursor *)pCursor,((Fts3Cursor *)pCursor)->pExpr,(int *)&local_140);
    psVar4 = local_78;
    uVar10 = local_140;
    sqlite3_blob_close(*(sqlite3_blob **)&local_78[0x13].nRef);
    *(undefined8 *)&psVar4[0x13].nRef = 0;
    bVar31 = false;
    pcVar12 = (char *)(ulong)uVar10;
    psVar23 = local_110;
    idxNum = local_d4;
    if (uVar10 == 0) {
      pcVar12 = ((Fts3Cursor *)pCursor)->aDoclist;
      ((Fts3Cursor *)pCursor)->pNextId = pcVar12;
      ((Fts3Cursor *)pCursor)->iPrevId = 0;
      bVar31 = true;
      uVar10 = 0;
    }
  }
  goto LAB_0017c912;
}

Assistant:

static int fts3FilterMethod(
  sqlite3_vtab_cursor *pCursor,   /* The cursor used for this query */
  int idxNum,                     /* Strategy index */
  const char *idxStr,             /* Unused */
  int nVal,                       /* Number of elements in apVal */
  sqlite3_value **apVal           /* Arguments for the indexing scheme */
){
  int rc = SQLITE_OK;
  char *zSql;                     /* SQL statement used to access %_content */
  int eSearch;
  Fts3Table *p = (Fts3Table *)pCursor->pVtab;
  Fts3Cursor *pCsr = (Fts3Cursor *)pCursor;

  sqlite3_value *pCons = 0;       /* The MATCH or rowid constraint, if any */
  sqlite3_value *pLangid = 0;     /* The "langid = ?" constraint, if any */
  sqlite3_value *pDocidGe = 0;    /* The "docid >= ?" constraint, if any */
  sqlite3_value *pDocidLe = 0;    /* The "docid <= ?" constraint, if any */
  int iIdx;

  UNUSED_PARAMETER(idxStr);
  UNUSED_PARAMETER(nVal);

  eSearch = (idxNum & 0x0000FFFF);
  assert( eSearch>=0 && eSearch<=(FTS3_FULLTEXT_SEARCH+p->nColumn) );
  assert( p->pSegments==0 );

  /* Collect arguments into local variables */
  iIdx = 0;
  if( eSearch!=FTS3_FULLSCAN_SEARCH ) pCons = apVal[iIdx++];
  if( idxNum & FTS3_HAVE_LANGID ) pLangid = apVal[iIdx++];
  if( idxNum & FTS3_HAVE_DOCID_GE ) pDocidGe = apVal[iIdx++];
  if( idxNum & FTS3_HAVE_DOCID_LE ) pDocidLe = apVal[iIdx++];
  assert( iIdx==nVal );

  /* In case the cursor has been used before, clear it now. */
  sqlite3_finalize(pCsr->pStmt);
  sqlite3_free(pCsr->aDoclist);
  sqlite3_free(pCsr->aMatchinfo);
  sqlite3Fts3ExprFree(pCsr->pExpr);
  memset(&pCursor[1], 0, sizeof(Fts3Cursor)-sizeof(sqlite3_vtab_cursor));

  /* Set the lower and upper bounds on docids to return */
  pCsr->iMinDocid = fts3DocidRange(pDocidGe, SMALLEST_INT64);
  pCsr->iMaxDocid = fts3DocidRange(pDocidLe, LARGEST_INT64);

  if( idxStr ){
    pCsr->bDesc = (idxStr[0]=='D');
  }else{
    pCsr->bDesc = p->bDescIdx;
  }
  pCsr->eSearch = (i16)eSearch;

  if( eSearch!=FTS3_DOCID_SEARCH && eSearch!=FTS3_FULLSCAN_SEARCH ){
    int iCol = eSearch-FTS3_FULLTEXT_SEARCH;
    const char *zQuery = (const char *)sqlite3_value_text(pCons);

    if( zQuery==0 && sqlite3_value_type(pCons)!=SQLITE_NULL ){
      return SQLITE_NOMEM;
    }

    pCsr->iLangid = 0;
    if( pLangid ) pCsr->iLangid = sqlite3_value_int(pLangid);

    assert( p->base.zErrMsg==0 );
    rc = sqlite3Fts3ExprParse(p->pTokenizer, pCsr->iLangid,
        p->azColumn, p->bFts4, p->nColumn, iCol, zQuery, -1, &pCsr->pExpr, 
        &p->base.zErrMsg
    );
    if( rc!=SQLITE_OK ){
      return rc;
    }

    rc = fts3EvalStart(pCsr);
    sqlite3Fts3SegmentsClose(p);
    if( rc!=SQLITE_OK ) return rc;
    pCsr->pNextId = pCsr->aDoclist;
    pCsr->iPrevId = 0;
  }

  /* Compile a SELECT statement for this cursor. For a full-table-scan, the
  ** statement loops through all rows of the %_content table. For a
  ** full-text query or docid lookup, the statement retrieves a single
  ** row by docid.
  */
  if( eSearch==FTS3_FULLSCAN_SEARCH ){
    if( pDocidGe || pDocidLe ){
      zSql = sqlite3_mprintf(
          "SELECT %s WHERE rowid BETWEEN %lld AND %lld ORDER BY rowid %s",
          p->zReadExprlist, pCsr->iMinDocid, pCsr->iMaxDocid,
          (pCsr->bDesc ? "DESC" : "ASC")
      );
    }else{
      zSql = sqlite3_mprintf("SELECT %s ORDER BY rowid %s", 
          p->zReadExprlist, (pCsr->bDesc ? "DESC" : "ASC")
      );
    }
    if( zSql ){
      rc = sqlite3_prepare_v2(p->db, zSql, -1, &pCsr->pStmt, 0);
      sqlite3_free(zSql);
    }else{
      rc = SQLITE_NOMEM;
    }
  }else if( eSearch==FTS3_DOCID_SEARCH ){
    rc = fts3CursorSeekStmt(pCsr, &pCsr->pStmt);
    if( rc==SQLITE_OK ){
      rc = sqlite3_bind_value(pCsr->pStmt, 1, pCons);
    }
  }
  if( rc!=SQLITE_OK ) return rc;

  return fts3NextMethod(pCursor);
}